

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::AllocateNewBlock
          (SerialArena *this,size_t n,AllocationPolicy *policy)

{
  __int_type_conflict1 _Var1;
  char *pcVar2;
  char *pcVar3;
  Memory MVar4;
  Block *pBStack_68;
  memory_order relaxed;
  Memory mem;
  AllocationPolicy *policy_local;
  size_t n_local;
  SerialArena *this_local;
  memory_order __b_1;
  memory_order __b;
  
  this->head_->start = (CleanupNode *)this->limit_;
  pcVar3 = this->ptr_;
  pcVar2 = Block::Pointer(this->head_,0x18);
  this->space_used_ = (size_t)(pcVar3 + (this->space_used_ - (long)pcVar2));
  MVar4 = AllocateMemory(policy,this->head_->size,n);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  _Var1 = (this->space_allocated_).super___atomic_base<unsigned_long>._M_i;
  mem.ptr = (void *)MVar4.size;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = _Var1 + (long)mem.ptr;
  pBStack_68 = (Block *)MVar4.ptr;
  Block::Block(pBStack_68,this->head_,(size_t)mem.ptr);
  this->head_ = pBStack_68;
  pcVar3 = Block::Pointer(this->head_,0x18);
  this->ptr_ = pcVar3;
  pcVar3 = Block::Pointer(this->head_,this->head_->size);
  this->limit_ = pcVar3;
  return;
}

Assistant:

void SerialArena::AllocateNewBlock(size_t n, const AllocationPolicy* policy) {
  // Sync limit to block
  head_->start = reinterpret_cast<CleanupNode*>(limit_);

  // Record how much used in this block.
  space_used_ += ptr_ - head_->Pointer(kBlockHeaderSize);

  auto mem = AllocateMemory(policy, head_->size, n);
  // We don't want to emit an expensive RMW instruction that requires
  // exclusive access to a cacheline. Hence we write it in terms of a
  // regular add.
  auto relaxed = std::memory_order_relaxed;
  space_allocated_.store(space_allocated_.load(relaxed) + mem.size, relaxed);
  head_ = new (mem.ptr) Block{head_, mem.size};
  ptr_ = head_->Pointer(kBlockHeaderSize);
  limit_ = head_->Pointer(head_->size);

#ifdef ADDRESS_SANITIZER
  ASAN_POISON_MEMORY_REGION(ptr_, limit_ - ptr_);
#endif  // ADDRESS_SANITIZER
}